

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyRunDiagnostics(TidyDoc tdoc)

{
  TidyDocImpl *impl;
  TidyDoc tdoc_local;
  
  if (tdoc == (TidyDoc)0x0) {
    tdoc_local._4_4_ = -0x16;
  }
  else {
    tdoc_local._4_4_ = tidyDocRunDiagnostics((TidyDocImpl *)tdoc);
  }
  return tdoc_local._4_4_;
}

Assistant:

int TIDY_CALL        tidyRunDiagnostics( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocRunDiagnostics( impl );
    return -EINVAL;
}